

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::addEvent<char_const*&,mserialize::string_view&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,char **args,string_view *args_1
          )

{
  QueueWriter *this_00;
  char **ppcVar1;
  Queue *pQVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t sizes [4];
  long local_58 [5];
  
  local_58[0] = 8;
  local_58[1] = 8;
  pcVar7 = "{null}";
  if (*args != (char *)0x0) {
    pcVar7 = *args;
  }
  sVar4 = strlen(pcVar7);
  local_58[2] = sVar4 + 4;
  local_58[3] = args_1->_len + 4;
  lVar9 = 0;
  lVar10 = 0;
  lVar5 = 0;
  do {
    lVar9 = lVar9 + local_58[lVar5];
    lVar10 = lVar10 + local_58[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 4);
  uVar8 = lVar10 + lVar9 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8) &&
       (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < uVar8)) &&
      (replaceChannel(this,uVar8),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8)) &&
     (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < uVar8)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)(lVar10 + lVar9);
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 4;
  *(uint64_t *)(pcVar7 + 4) = eventSourceId;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 8;
  *(uint64_t *)(pcVar7 + 8) = clock;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 8;
  mserialize::CustomSerializer<const_char_*,_void>::serialize<binlog::detail::QueueWriter>
            (*args,this_00);
  uVar8 = args_1->_len;
  iVar3 = (int)uVar8;
  *(int *)(this->_qw)._writePos = iVar3;
  pcVar7 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar7;
  if (iVar3 != 0) {
    uVar8 = uVar8 & 0xffffffff;
    memcpy(pcVar7,args_1->_ptr,uVar8);
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + uVar8;
  }
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar2->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}